

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory64Lowering.cpp
# Opt level: O0

void __thiscall
wasm::Memory64Lowering::visitElementSegment(Memory64Lowering *this,ElementSegment *segment)

{
  Name base;
  bool bVar1;
  Table *this_00;
  int64_t iVar2;
  GlobalGet *pGVar3;
  Global *this_01;
  Const *pCVar4;
  Name name;
  Type local_168;
  Type local_160;
  char *local_158;
  Type TStack_150;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> local_148;
  Builder local_140;
  Builder builder;
  Global *local_110;
  Global *memoryBase32;
  ImportInfo info;
  Global *g;
  GlobalGet *get;
  Literal local_50;
  Const *local_38;
  Const *c;
  pointer local_28;
  Module *local_20;
  Module *module;
  ElementSegment *segment_local;
  Memory64Lowering *this_local;
  
  module = (Module *)segment;
  segment_local = (ElementSegment *)this;
  local_20 = Walker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>::getModule
                       (&(this->
                         super_WalkerPass<wasm::PostWalker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>_>
                         ).
                         super_PostWalker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>
                         .
                         super_Walker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>
                       );
  bVar1 = IString::isNull((IString *)&module->functions);
  if (!bVar1) {
    c = (Const *)(module->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    local_28 = (module->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    this_00 = Module::getTable(local_20,(IString)*(IString *)
                                                  &(module->functions).
                                                                                                      
                                                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                                  ._M_impl.super__Vector_impl_data);
    bVar1 = Table::is64(this_00);
    if (bVar1) {
      local_38 = Expression::dynCast<wasm::Const>
                           ((Expression *)
                            (module->functions).
                            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (local_38 == (Const *)0x0) {
        pGVar3 = Expression::dynCast<wasm::GlobalGet>
                           ((Expression *)
                            (module->functions).
                            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (pGVar3 == (GlobalGet *)0x0) {
          handle_unreachable("unexpected elem offset",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Memory64Lowering.cpp"
                             ,0x117);
        }
        info.importedTags.super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)(pGVar3->name).super_IString.str._M_len
        ;
        this_01 = Module::getGlobal(local_20,(Name)(pGVar3->name).super_IString.str);
        bVar1 = Importable::imported(&this_01->super_Importable);
        if ((bVar1) &&
           (bVar1 = IString::operator==(&(this_01->super_Importable).base.super_IString,
                                        (IString *)TABLE_BASE), bVar1)) {
          ImportInfo::ImportInfo((ImportInfo *)&memoryBase32,local_20);
          builder.wasm = (Module *)TABLE_BASE32._0_8_;
          base.super_IString.str._M_str = (char *)TABLE_BASE32._8_8_;
          base.super_IString.str._M_len = TABLE_BASE32._0_8_;
          local_110 = ImportInfo::getImportedGlobal
                                ((ImportInfo *)&memoryBase32,
                                 (Name)(this_01->super_Importable).module.super_IString.str,base);
          if (local_110 == (Global *)0x0) {
            Builder::Builder(&local_140,local_20);
            local_158 = (char *)TABLE_BASE32._0_8_;
            TStack_150.id = TABLE_BASE32._8_8_;
            wasm::Type::Type(&local_160,i32);
            pCVar4 = Builder::makeConst<int>(&local_140,0);
            name.super_IString.str._M_str = local_158;
            name.super_IString.str._M_len = (size_t)&local_148;
            Builder::makeGlobal(name,TStack_150,(Expression *)local_160.id,(Mutability)pCVar4);
            local_110 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::release
                                  (&local_148);
            std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::~unique_ptr
                      (&local_148);
            wasm::Name::operator=
                      (&(local_110->super_Importable).module,&(this_01->super_Importable).module);
            wasm::Name::operator=(&(local_110->super_Importable).base,(Name *)TABLE_BASE32);
            Module::addGlobal(local_20,local_110);
          }
          if (local_110 == (Global *)0x0) {
            __assert_fail("memoryBase32",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Memory64Lowering.cpp"
                          ,0x112,
                          "void wasm::Memory64Lowering::visitElementSegment(ElementSegment *)");
          }
          wasm::Type::Type(&local_168,i32);
          (pGVar3->super_SpecificExpression<(wasm::Expression::Id)10>).super_Expression.type.id =
               local_168.id;
          wasm::Name::operator=(&pGVar3->name,(Name *)local_110);
          ImportInfo::~ImportInfo((ImportInfo *)&memoryBase32);
        }
      }
      else {
        iVar2 = wasm::Literal::geti64(&local_38->value);
        wasm::Literal::Literal(&local_50,(uint32_t)iVar2);
        wasm::Literal::operator=(&local_38->value,&local_50);
        wasm::Literal::~Literal(&local_50);
        wasm::Type::Type((Type *)&get,i32);
        (local_38->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id =
             (uintptr_t)get;
      }
    }
  }
  return;
}

Assistant:

void visitElementSegment(ElementSegment* segment) {
    auto& module = *getModule();

    // Passive segments don't have any offset to update.
    if (segment->table.isNull() || !module.getTable(segment->table)->is64()) {
      return;
    }

    if (auto* c = segment->offset->dynCast<Const>()) {
      c->value = Literal(static_cast<uint32_t>(c->value.geti64()));
      c->type = Type::i32;
    } else if (auto* get = segment->offset->dynCast<GlobalGet>()) {
      auto* g = module.getGlobal(get->name);
      if (g->imported() && g->base == TABLE_BASE) {
        ImportInfo info(module);
        auto* memoryBase32 = info.getImportedGlobal(g->module, TABLE_BASE32);
        if (!memoryBase32) {
          Builder builder(module);
          memoryBase32 = builder
                           .makeGlobal(TABLE_BASE32,
                                       Type::i32,
                                       builder.makeConst(int32_t(0)),
                                       Builder::Immutable)
                           .release();
          memoryBase32->module = g->module;
          memoryBase32->base = TABLE_BASE32;
          module.addGlobal(memoryBase32);
        }
        // Use this alternative import when initializing the segment.
        assert(memoryBase32);
        get->type = Type::i32;
        get->name = memoryBase32->name;
      }
    } else {
      WASM_UNREACHABLE("unexpected elem offset");
    }
  }